

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitBinary(WasmBinaryBuilder *this,Expression **out,uint8_t code)

{
  bool bVar1;
  Expression *pEVar2;
  Binary *local_30;
  Binary *curr;
  uint8_t code_local;
  Expression **out_local;
  WasmBinaryBuilder *this_local;
  
  switch(code) {
  case 'F':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqInt32;
    break;
  case 'G':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeInt32;
    break;
  case 'H':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtSInt32;
    break;
  case 'I':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtUInt32;
    break;
  case 'J':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtSInt32;
    break;
  case 'K':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtUInt32;
    break;
  case 'L':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeSInt32;
    break;
  case 'M':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeUInt32;
    break;
  case 'N':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeSInt32;
    break;
  case 'O':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeUInt32;
    break;
  default:
    return false;
  case 'Q':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqInt64;
    break;
  case 'R':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeInt64;
    break;
  case 'S':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtSInt64;
    break;
  case 'T':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtUInt64;
    break;
  case 'U':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtSInt64;
    break;
  case 'V':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtUInt64;
    break;
  case 'W':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeSInt64;
    break;
  case 'X':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeUInt64;
    break;
  case 'Y':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeSInt64;
    break;
  case 'Z':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeUInt64;
    break;
  case '[':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqFloat32;
    break;
  case '\\':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeFloat32;
    break;
  case ']':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtFloat32;
    break;
  case '^':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtFloat32;
    break;
  case '_':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeFloat32;
    break;
  case '`':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeFloat32;
    break;
  case 'a':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqFloat64;
    break;
  case 'b':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeFloat64;
    break;
  case 'c':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtFloat64;
    break;
  case 'd':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtFloat64;
    break;
  case 'e':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeFloat64;
    break;
  case 'f':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeFloat64;
    break;
  case 'j':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddInt32;
    break;
  case 'k':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubInt32;
    break;
  case 'l':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulInt32;
    break;
  case 'm':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivSInt32;
    break;
  case 'n':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivUInt32;
    break;
  case 'o':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RemSInt32;
    break;
  case 'p':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RemUInt32;
    break;
  case 'q':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AndInt32;
    break;
  case 'r':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = OrInt32;
    break;
  case 's':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = XorInt32;
    break;
  case 't':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ShlInt32;
    break;
  case 'u':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ShrSInt32;
    break;
  case 'v':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ShrUInt32;
    break;
  case 'w':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RotLInt32;
    break;
  case 'x':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RotRInt32;
    break;
  case '|':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddInt64;
    break;
  case '}':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubInt64;
    break;
  case '~':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulInt64;
    break;
  case '\x7f':
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivSInt64;
    break;
  case 0x80:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivUInt64;
    break;
  case 0x81:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RemSInt64;
    break;
  case 0x82:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RemUInt64;
    break;
  case 0x83:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AndInt64;
    break;
  case 0x84:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = OrInt64;
    break;
  case 0x85:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = XorInt64;
    break;
  case 0x86:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ShlInt64;
    break;
  case 0x87:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ShrSInt64;
    break;
  case 0x88:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ShrUInt64;
    break;
  case 0x89:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RotLInt64;
    break;
  case 0x8a:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RotRInt64;
    break;
  case 0x92:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddFloat32;
    break;
  case 0x93:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubFloat32;
    break;
  case 0x94:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulFloat32;
    break;
  case 0x95:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivFloat32;
    break;
  case 0x96:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinFloat32;
    break;
  case 0x97:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxFloat32;
    break;
  case 0x98:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = CopySignFloat32;
    break;
  case 0xa0:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddFloat64;
    break;
  case 0xa1:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubFloat64;
    break;
  case 0xa2:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulFloat64;
    break;
  case 0xa3:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivFloat64;
    break;
  case 0xa4:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinFloat64;
    break;
  case 0xa5:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxFloat64;
    break;
  case 0xa6:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = CopySignFloat64;
  }
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"zz node: Binary\n");
  }
  pEVar2 = popNonVoidExpression(this);
  local_30->right = pEVar2;
  pEVar2 = popNonVoidExpression(this);
  local_30->left = pEVar2;
  Binary::finalize(local_30);
  *out = (Expression *)local_30;
  return true;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitBinary(Expression*& out, uint8_t code) {
  Binary* curr;
#define INT_TYPED_CODE(code)                                                   \
  {                                                                            \
    case BinaryConsts::I32##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Int32;                                                  \
      break;                                                                   \
    case BinaryConsts::I64##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Int64;                                                  \
      break;                                                                   \
  }
#define FLOAT_TYPED_CODE(code)                                                 \
  {                                                                            \
    case BinaryConsts::F32##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Float32;                                                \
      break;                                                                   \
    case BinaryConsts::F64##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Float64;                                                \
      break;                                                                   \
  }
#define TYPED_CODE(code)                                                       \
  {                                                                            \
    INT_TYPED_CODE(code)                                                       \
    FLOAT_TYPED_CODE(code)                                                     \
  }

  switch (code) {
    TYPED_CODE(Add);
    TYPED_CODE(Sub);
    TYPED_CODE(Mul);
    INT_TYPED_CODE(DivS);
    INT_TYPED_CODE(DivU);
    INT_TYPED_CODE(RemS);
    INT_TYPED_CODE(RemU);
    INT_TYPED_CODE(And);
    INT_TYPED_CODE(Or);
    INT_TYPED_CODE(Xor);
    INT_TYPED_CODE(Shl);
    INT_TYPED_CODE(ShrU);
    INT_TYPED_CODE(ShrS);
    INT_TYPED_CODE(RotL);
    INT_TYPED_CODE(RotR);
    FLOAT_TYPED_CODE(Div);
    FLOAT_TYPED_CODE(CopySign);
    FLOAT_TYPED_CODE(Min);
    FLOAT_TYPED_CODE(Max);
    TYPED_CODE(Eq);
    TYPED_CODE(Ne);
    INT_TYPED_CODE(LtS);
    INT_TYPED_CODE(LtU);
    INT_TYPED_CODE(LeS);
    INT_TYPED_CODE(LeU);
    INT_TYPED_CODE(GtS);
    INT_TYPED_CODE(GtU);
    INT_TYPED_CODE(GeS);
    INT_TYPED_CODE(GeU);
    FLOAT_TYPED_CODE(Lt);
    FLOAT_TYPED_CODE(Le);
    FLOAT_TYPED_CODE(Gt);
    FLOAT_TYPED_CODE(Ge);
    default:
      return false;
  }
  BYN_TRACE("zz node: Binary\n");
  curr->right = popNonVoidExpression();
  curr->left = popNonVoidExpression();
  curr->finalize();
  out = curr;
  return true;
#undef TYPED_CODE
#undef INT_TYPED_CODE
#undef FLOAT_TYPED_CODE
}